

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O3

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  int i;
  long lVar8;
  long lVar9;
  ulong uVar10;
  TPZVec<int> filtVecShape;
  ulong local_1c8;
  TPZVec<int> local_1a0;
  int aiStack_180 [4];
  TPZVec<int> local_170;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  uVar3 = pztopology::TPZTriangle::NumSides(1);
  TPZVec<int>::TPZVec(&local_1a0,0);
  local_1a0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdaf8;
  local_1a0.fStore = aiStack_180;
  local_1a0.fNElements = 4;
  local_1a0.fNAlloc = 0;
  aiStack_180[0] = 0;
  aiStack_180[1] = 0;
  aiStack_180[2] = 0;
  aiStack_180[3] = 0;
  iVar4 = TPZShapeHCurl<pzshape::TPZShapeTriang>::ComputeNConnectShapeF
                    (0,*(data->fHDivConnectOrders).super_TPZVec<int>.fStore);
  lVar8 = 1;
  do {
    local_1a0.fStore[lVar8] = iVar4;
    iVar5 = TPZShapeHCurl<pzshape::TPZShapeTriang>::ComputeNConnectShapeF
                      ((int)lVar8,(data->fHDivConnectOrders).super_TPZVec<int>.fStore[lVar8]);
    iVar4 = iVar4 + iVar5;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  lVar8 = (long)iVar4;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_c0.fElem = (double *)0x0;
  local_c0.fGiven = (double *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_c0.fWork.fStore = (double *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (iVar4 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar10 = lVar8 << 4;
    }
    local_c0.fElem = (double *)operator_new__(uVar10);
  }
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_150.fElem = (double *)0x0;
  local_150.fGiven = (double *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar8;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_150.fWork.fStore = (double *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar4 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar10 = lVar8 << 3;
    }
    local_150.fElem = (double *)operator_new__(uVar10);
  }
  TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(pt,data,&local_c0,&local_150);
  if ((int)uVar3 < 1) {
    local_1c8 = 0;
  }
  else {
    local_1c8 = (ulong)uVar3;
    uVar10 = 0;
    do {
      iVar4 = local_1a0.fStore[uVar10];
      lVar9 = (long)iVar4;
      lVar8 = lVar9 + 1;
      lVar6 = 0;
      bVar2 = true;
      do {
        bVar7 = bVar2;
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) || (iVar4 < 0)) ||
           (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar6) || (iVar4 < -1))
           || (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar6) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar10)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[lVar1 * uVar10 + lVar6] =
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar6] +
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8 + lVar6];
        lVar6 = 1;
        bVar2 = false;
      } while (bVar7);
      if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) || (iVar4 < 0)) ||
         (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar4 < -1) || (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar6 = (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar6 < 1) ||
         ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar10)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      curlphi->fElem[lVar6 * uVar10] =
           local_150.fElem[local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9] +
           local_150.fElem[local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar8];
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_1c8);
  }
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  local_170.fStore = (int *)0x0;
  local_170.fNElements = 0;
  local_170.fNAlloc = 0;
  HighOrderFunctionsFilter(&local_1a0,&(data->fHDivConnectOrders).super_TPZVec<int>,&local_170);
  if (0 < local_170.fNElements) {
    lVar8 = 0;
    do {
      iVar4 = local_170.fStore[lVar8];
      lVar6 = (long)iVar4;
      if (((local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) || (iVar4 < 0)) ||
         (local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 1) ||
         ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)local_1c8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      curlphi->fElem[lVar9 * local_1c8] =
           local_150.fElem[local_150.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6];
      lVar9 = 0;
      bVar2 = true;
      do {
        bVar7 = bVar2;
        if (((local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar9) || (iVar4 < 0)) ||
           (local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar6)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar1 <= lVar9) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)local_1c8)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        phi->fElem[lVar1 * local_1c8 + lVar9] =
             local_c0.fElem
             [local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar6 + lVar9];
        lVar9 = 1;
        bVar2 = false;
      } while (bVar7);
      local_1c8 = local_1c8 + 1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != local_170.fNElements);
  }
  local_170._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  if (local_170.fStore != (int *)0x0) {
    operator_delete__(local_170.fStore);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  if (local_1a0.fStore != aiStack_180) {
    local_1a0.fNAlloc = 0;
    local_1a0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_1a0.fStore != (int *)0x0) {
      operator_delete__(local_1a0.fStore);
    }
  }
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}